

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLCLEARNAMEDFRAMEBUFFERIVPROC epoxy_glClearNamedFramebufferiv_resolver(void)

{
  PFNGLCLEARNAMEDFRAMEBUFFERIVPROC p_Var1;
  
  p_Var1 = (PFNGLCLEARNAMEDFRAMEBUFFERIVPROC)
           gl_provider_resolver
                     ("glClearNamedFramebufferiv",
                      epoxy_glClearNamedFramebufferiv_resolver::providers,
                      epoxy_glClearNamedFramebufferiv_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLCLEARNAMEDFRAMEBUFFERIVPROC
epoxy_glClearNamedFramebufferiv_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        3933 /* "glClearNamedFramebufferiv" */,
        3933 /* "glClearNamedFramebufferiv" */,
    };
    return gl_provider_resolver(entrypoint_strings + 3933 /* "glClearNamedFramebufferiv" */,
                                providers, entrypoints);
}